

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::submit
          (RenderFragmentUniformTexelBuffer *this,SubmitContext *context)

{
  deUint64 dVar1;
  undefined8 uVar2;
  Context *this_00;
  DeviceInterface *pDVar3;
  VkCommandBuffer pVVar4;
  Handle<(vk::HandleType)18> *pHVar5;
  size_type sVar6;
  unsigned_long uVar7;
  Handle<(vk::HandleType)16> *pHVar8;
  reference pvVar9;
  unsigned_long local_58;
  unsigned_long local_50;
  deUint32 local_44;
  undefined4 local_40;
  anon_struct_12_3_59eec259 callParams;
  size_t descriptorSetNdx;
  VkCommandBuffer commandBuffer;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  RenderFragmentUniformTexelBuffer *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar3 = Context::getDeviceInterface(this_00);
  pVVar4 = SubmitContext::getCommandBuffer(context);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&this->m_resources);
  (*pDVar3->_vptr_DeviceInterface[0x4c])(pDVar3,pVVar4,0,pHVar5->m_internal);
  callParams.valuesPerPixel = 0;
  callParams.maxUniformTexelCount = 0;
  while( true ) {
    uVar2 = callParams._4_8_;
    sVar6 = std::
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            ::size(&this->m_descriptorSets);
    if (sVar6 <= (ulong)uVar2) break;
    local_44 = callParams.valuesPerPixel;
    sVar6 = std::
            vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
            ::size(&this->m_descriptorSets);
    local_50 = de::min<unsigned_long>(this->m_bufferSize >> 2,(ulong)this->m_maxUniformTexelCount);
    local_50 = sVar6 * local_50;
    local_58 = this->m_targetWidth * this->m_targetHeight;
    uVar7 = divRoundUp<unsigned_long>(&local_50,&local_58);
    local_40 = (undefined4)uVar7;
    callParams.callId = this->m_maxUniformTexelCount;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       (&(this->m_resources).pipelineLayout.
                         super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    dVar1 = pHVar8->m_internal;
    pvVar9 = std::
             vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
             ::operator[](&this->m_descriptorSets,callParams._4_8_);
    (*pDVar3->_vptr_DeviceInterface[0x56])(pDVar3,pVVar4,0,dVar1,0,1,pvVar9,0,0);
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       (&(this->m_resources).pipelineLayout.
                         super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    (*pDVar3->_vptr_DeviceInterface[0x73])(pDVar3,pVVar4,pHVar8->m_internal,0x10,0,0xc,&local_44);
    (*pDVar3->_vptr_DeviceInterface[0x59])(pDVar3,pVVar4,6,1);
    callParams._4_8_ = callParams._4_8_ + 1;
  }
  return;
}

Assistant:

void RenderFragmentUniformTexelBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const struct
		{
			const deUint32	callId;
			const deUint32	valuesPerPixel;
			const deUint32	maxUniformTexelCount;
		} callParams =
		{
			(deUint32)descriptorSetNdx,
			(deUint32)divRoundUp<size_t>(m_descriptorSets.size() * de::min<size_t>((size_t)m_bufferSize / 4, m_maxUniformTexelCount), m_targetWidth * m_targetHeight),
			m_maxUniformTexelCount
		};

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdPushConstants(commandBuffer, *m_resources.pipelineLayout, vk::VK_SHADER_STAGE_FRAGMENT_BIT, 0u, (deUint32)sizeof(callParams), &callParams);
		vkd.cmdDraw(commandBuffer, 6, 1, 0, 0);
	}
}